

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture_calcLevelOffset_OffsetOfEachLevelD32_SFLOAT_S8_UINT_Test::
TestBody(ktxTexture_calcLevelOffset_OffsetOfEachLevelD32_SFLOAT_S8_UINT_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_1;
  ktx_size_t levelOffset;
  ktx_uint32_t i;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ktx_uint32_t ktx2offsets [4];
  ktx_error_code_e result;
  TestCreateInfo createInfo;
  ktxTexture2 *ktx2texture;
  undefined4 uVar2;
  ktx_uint32_t in_stack_fffffffffffffeac;
  undefined4 uVar3;
  ktx_uint32_t in_stack_fffffffffffffeb4;
  undefined4 uVar4;
  ktx_uint32_t in_stack_fffffffffffffebc;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffec4;
  char *in_stack_fffffffffffffec8;
  Message *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  AssertHelper *in_stack_fffffffffffffee0;
  ktx_uint32_t in_stack_fffffffffffffee8;
  AssertionResult local_100;
  char *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  uint uVar6;
  undefined4 in_stack_ffffffffffffff1c;
  char *in_stack_ffffffffffffff20;
  AssertionResult *in_stack_ffffffffffffff28;
  AssertHelper *in_stack_ffffffffffffff30;
  AssertionResult local_a0 [3];
  undefined4 local_6c;
  AssertionResult local_68;
  undefined8 local_58;
  undefined8 local_50;
  undefined4 local_44;
  undefined1 local_40 [32];
  uint local_20;
  long local_10 [2];
  
  local_10[0] = 0;
  uVar2 = 0x82;
  uVar3 = 0;
  uVar4 = 1;
  uVar5 = 1;
  TestCreateInfo::TestCreateInfo
            ((TestCreateInfo *)CONCAT44(in_stack_fffffffffffffec4,1),in_stack_fffffffffffffebc,1,
             in_stack_fffffffffffffeb4,0,in_stack_fffffffffffffeac,
             (ktx_uint32_t)in_stack_fffffffffffffed0,false,(ktx_uint32_t)in_stack_fffffffffffffee0,
             in_stack_fffffffffffffee8);
  local_58 = 0x28000000a8;
  local_50 = 8;
  local_44 = ktxTexture2_Create(local_40,0,local_10);
  local_6c = 0;
  testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
            (in_stack_fffffffffffffec8,(char *)CONCAT44(in_stack_fffffffffffffec4,uVar5),
             (ktx_error_code_e *)CONCAT44(in_stack_fffffffffffffebc,uVar4),
             (ktx_error_code_e *)CONCAT44(in_stack_fffffffffffffeb4,uVar3));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_68);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffee0);
    testing::AssertionResult::failure_message((AssertionResult *)0x143642);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffee0,(Type)((ulong)in_stack_fffffffffffffed8 >> 0x20),
               (char *)in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffec4,uVar5));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff30,(Message *)in_stack_ffffffffffffff28);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffeb4,uVar3));
    testing::Message::~Message((Message *)0x14369f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14370d);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffffeb4,uVar3),
             (bool *)CONCAT44(in_stack_fffffffffffffeac,uVar2),(type *)0x14373b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffee0);
    in_stack_fffffffffffffee0 =
         (AssertHelper *)
         testing::Message::operator<<
                   ((Message *)CONCAT44(in_stack_fffffffffffffeb4,uVar3),
                    (char (*) [28])CONCAT44(in_stack_fffffffffffffeac,uVar2));
    in_stack_fffffffffffffed8 = ktxErrorString(local_44);
    in_stack_fffffffffffffed0 =
         testing::Message::operator<<
                   ((Message *)CONCAT44(in_stack_fffffffffffffeb4,uVar3),
                    (char **)CONCAT44(in_stack_fffffffffffffeac,uVar2));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
               (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               in_stack_ffffffffffffff10);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffee0,(Type)((ulong)in_stack_fffffffffffffed8 >> 0x20),
               (char *)in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffec4,uVar5));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff30,(Message *)in_stack_ffffffffffffff28);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffeb4,uVar3));
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
    testing::Message::~Message((Message *)0x143856);
  }
  uVar6 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1438fa);
  if (uVar6 == 0) {
    for (uVar6 = 0; uVar6 < local_20; uVar6 = uVar6 + 1) {
      ktxTexture2_calcLevelOffset(local_10[0],uVar6);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                (in_stack_fffffffffffffec8,(char *)CONCAT44(in_stack_fffffffffffffec4,uVar5),
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffffebc,uVar4),
                 (uint *)CONCAT44(in_stack_fffffffffffffeb4,uVar3));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffee0);
        in_stack_fffffffffffffec8 =
             testing::AssertionResult::failure_message((AssertionResult *)0x1439a5);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffee0,(Type)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                   (char *)in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20)
                   ,(char *)CONCAT44(in_stack_fffffffffffffec4,uVar5));
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff30,(Message *)in_stack_ffffffffffffff28);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffeb4,uVar3));
        testing::Message::~Message((Message *)0x1439f3);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x143a55);
    }
    if (local_10[0] != 0) {
      (*(code *)**(undefined8 **)(local_10[0] + 8))(local_10[0]);
    }
  }
  return;
}

Assistant:

TEST(ktxTexture_calcLevelOffset, OffsetOfEachLevelD32_SFLOAT_S8_UINT) {
    ktxTexture2* ktx2texture = 0;
    TestCreateInfo createInfo(9, 9, 1, 2, 0,
                              VK_FORMAT_D32_SFLOAT_S8_UINT, KTX_FALSE, 1, 1);
    KTX_error_code result;
    // Offsets for 9x9, 4 level  texture.
    // KTX 2: level 0 ... level 4 with mip padding to an 8 byte alignment.
    ktx_uint32_t ktx2offsets[] = {8+32+128, 8+32, 8, 0};

    result = ktxTexture2_Create(&createInfo, KTX_TEXTURE_CREATE_NO_STORAGE,
                                &ktx2texture);
    EXPECT_EQ(result, KTX_SUCCESS);
    ASSERT_TRUE(ktx2texture != NULL) << "ktxTexture2_Create failed: "
                                 << ktxErrorString(result);

    for (ktx_uint32_t i = 0; i < createInfo.numLevels; i++) {
        ktx_size_t levelOffset;
        levelOffset = ktxTexture2_calcLevelOffset(ktx2texture, i);
        EXPECT_EQ(levelOffset, ktx2offsets[i]);
    }
    if (ktx2texture)
        ktxTexture_Destroy(ktxTexture(ktx2texture));
}